

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::verify
          (ShaderAtomicAndCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision PVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int in_stack_00000008;
  long in_stack_00000010;
  Hex<8UL> local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar12 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  local_1b8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar12;
  uVar5 = local_1b8 & 0xffffffff;
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar6 = 0xff;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar6 = 0xffff;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) {
    uVar6 = 0xffffffff;
  }
  if (PVar2 == PRECISION_HIGHP) {
    uVar6 = 0xffffffff;
  }
  if (0 < (int)local_1b8) {
    uVar3 = (this->super_ShaderAtomicOpCase).m_initialValue;
    local_1b8 = local_1b8 & 0xffffffff;
    uVar5 = (ulong)uVar12;
    uVar8 = 0;
    iVar17 = 0;
    uVar16 = 0;
    uVar11 = 0;
    do {
      iVar15 = (int)uVar16;
      uVar4 = *(uint *)(in_stack_00000010 + iVar15 * in_stack_00000008);
      iVar7 = (int)uVar8;
      uVar10 = uVar5;
      iVar13 = iVar17;
      uVar9 = uVar3;
      if ((int)uVar12 < 1) {
        uVar10 = (ulong)(uVar3 ^ uVar4);
        if (((uVar3 ^ uVar4) & uVar6) != 0) goto LAB_01463819;
      }
      else {
        do {
          uVar9 = uVar9 & *(uint *)(siglen + (long)iVar13);
          iVar13 = iVar13 + (int)sig;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        if (((uVar9 ^ uVar4) & uVar6) != 0) {
LAB_01463819:
          local_1b0._0_8_ =
               ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: at group ",0x10);
          std::ostream::operator<<(poVar1,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected ",0xb);
          local_1c0.value = (deUint64)uVar9;
          tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
          local_1c0.value = (ulong)uVar4;
          tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_014637e0:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          return (int)uVar11;
        }
        uVar10 = (ulong)(uVar9 ^ uVar4);
        if (0 < (int)uVar12) {
          uVar14 = 0;
          do {
            uVar4 = *(uint *)(tbslen + (long)(int)uVar8);
            if ((~uVar3 & uVar6 & uVar4) != 0) {
              local_1b0._0_8_ =
                   ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"ERROR: at group ",0x10);
              std::ostream::operator<<(poVar1,iVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", invocation ",0xd);
              std::ostream::operator<<(poVar1,(int)uVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,": found unexpected value ",0x19);
              local_1c0.value = (ulong)uVar4;
              tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_014637e0;
            }
            uVar14 = uVar14 + 1;
            uVar8 = (ulong)(uint)((int)uVar8 + (int)tbs);
            uVar10 = uVar8;
          } while (uVar5 != uVar14);
        }
      }
      uVar16 = uVar16 + 1;
      uVar11 = CONCAT71((int7)(uVar10 >> 8),local_1b8 <= uVar16);
      iVar17 = iVar17 + uVar12 * (int)sig;
      uVar8 = (ulong)(iVar7 + uVar12 * (int)tbs);
    } while (uVar16 != local_1b8);
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),1);
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue &= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & ~m_initialValue)) != 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}